

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O1

MPP_RET hal_h264e_vepu580_init(void *hal,MppEncHalCfg *cfg)

{
  int iVar1;
  MppEncCfgSet *pMVar2;
  MPP_RET MVar3;
  void *pvVar4;
  HalH264eVepu580Tune *pHVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  mpp_env_get_u32("disable_rcb_buf",&disable_rcb_buf,0);
  cfg->type = VPU_CLIENT_RKVENC;
  MVar3 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar3 == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    iVar1 = cfg->task_cnt;
    *(int *)((long)hal + 0x14) = iVar1;
    if ((1 < iVar1 - 1U) &&
       (_mpp_log_l(2,"hal_h264e_vepu580","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->task_cnt && p->task_cnt <= 2","hal_h264e_vepu580_init",0x136),
       (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    MVar3 = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (MVar3 == MPP_OK) {
      pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",(ulong)*(uint *)((long)hal + 0x14) * 0x1cb8)
      ;
      *(void **)((long)hal + 0x1a0) = pvVar4;
      if (pvVar4 == (void *)0x0) {
        pcVar7 = "init register buffer failed\n";
      }
      else {
        pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",(ulong)*(uint *)((long)hal + 0x14) * 0x60)
        ;
        *(void **)((long)hal + 0x1a8) = pvVar4;
        if (pvVar4 != (void *)0x0) {
          if ((ulong)*(uint *)((long)hal + 0x14) < 2) {
LAB_0022194e:
            *(undefined8 *)((long)hal + 0x200) = 0x2800000008;
            pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                     (ulong)(uint)(*(int *)((long)hal + 0x14) * 0x28));
            *(void **)((long)hal + 0x208) = pvVar4;
            if (pvVar4 != (void *)0x0) {
              *(long *)((long)hal + 0x138) = *(long *)((long)hal + 0x1a0) + 0x1210;
              *(undefined8 *)((long)hal + 0x140) = *(undefined8 *)((long)hal + 8);
              *(undefined8 *)((long)hal + 0x148) = 0;
              *(long *)((long)hal + 0x150) = *hal + 0x1438;
              *(undefined8 *)((long)hal + 0x158) = 0;
              *(undefined8 *)((long)hal + 0x160) = 0;
              pMVar2 = cfg->cfg;
              (pMVar2->hw).qp_delta_row_i = 2;
              (pMVar2->hw).qbias_i = 0x2ab;
              (pMVar2->hw).qbias_p = 0x155;
              (pMVar2->hw).qbias_en = 0;
              (pMVar2->hw).qp_delta_row = 2;
              (pMVar2->hw).extra_buf = 1;
              (pMVar2->hw).aq_thrd_i[0xc] = 0xf;
              (pMVar2->hw).aq_thrd_i[0xd] = 0x14;
              (pMVar2->hw).aq_thrd_i[0xe] = 0x19;
              (pMVar2->hw).aq_thrd_i[0xf] = 0x23;
              (pMVar2->hw).aq_thrd_i[8] = 8;
              (pMVar2->hw).aq_thrd_i[9] = 8;
              (pMVar2->hw).aq_thrd_i[10] = 8;
              (pMVar2->hw).aq_thrd_i[0xb] = 0xf;
              (pMVar2->hw).aq_thrd_i[4] = 3;
              (pMVar2->hw).aq_thrd_i[5] = 3;
              (pMVar2->hw).aq_thrd_i[6] = 5;
              (pMVar2->hw).aq_thrd_i[7] = 5;
              (pMVar2->hw).aq_thrd_i[0] = 0;
              (pMVar2->hw).aq_thrd_i[1] = 0;
              (pMVar2->hw).aq_thrd_i[2] = 0;
              (pMVar2->hw).aq_thrd_i[3] = 0;
              (pMVar2->hw).aq_thrd_p[0xc] = 0xf;
              (pMVar2->hw).aq_thrd_p[0xd] = 0x14;
              (pMVar2->hw).aq_thrd_p[0xe] = 0x19;
              (pMVar2->hw).aq_thrd_p[0xf] = 0x23;
              (pMVar2->hw).aq_thrd_p[8] = 8;
              (pMVar2->hw).aq_thrd_p[9] = 8;
              (pMVar2->hw).aq_thrd_p[10] = 8;
              (pMVar2->hw).aq_thrd_p[0xb] = 0xf;
              (pMVar2->hw).aq_thrd_p[4] = 3;
              (pMVar2->hw).aq_thrd_p[5] = 3;
              (pMVar2->hw).aq_thrd_p[6] = 5;
              (pMVar2->hw).aq_thrd_p[7] = 5;
              (pMVar2->hw).aq_thrd_p[0] = 0;
              (pMVar2->hw).aq_thrd_p[1] = 0;
              (pMVar2->hw).aq_thrd_p[2] = 0;
              (pMVar2->hw).aq_thrd_p[3] = 0;
              (pMVar2->hw).aq_step_i[0xc] = 4;
              (pMVar2->hw).aq_step_i[0xd] = 5;
              (pMVar2->hw).aq_step_i[0xe] = 6;
              (pMVar2->hw).aq_step_i[0xf] = 8;
              (pMVar2->hw).aq_step_i[8] = 0;
              (pMVar2->hw).aq_step_i[9] = 1;
              (pMVar2->hw).aq_step_i[10] = 2;
              (pMVar2->hw).aq_step_i[0xb] = 3;
              (pMVar2->hw).aq_step_i[4] = -4;
              (pMVar2->hw).aq_step_i[5] = -3;
              (pMVar2->hw).aq_step_i[6] = -2;
              (pMVar2->hw).aq_step_i[7] = -1;
              (pMVar2->hw).aq_step_i[0] = -8;
              (pMVar2->hw).aq_step_i[1] = -7;
              (pMVar2->hw).aq_step_i[2] = -6;
              (pMVar2->hw).aq_step_i[3] = -5;
              (pMVar2->hw).aq_step_p[0xc] = 4;
              (pMVar2->hw).aq_step_p[0xd] = 5;
              (pMVar2->hw).aq_step_p[0xe] = 7;
              (pMVar2->hw).aq_step_p[0xf] = 8;
              (pMVar2->hw).aq_step_p[8] = 0;
              (pMVar2->hw).aq_step_p[9] = 1;
              (pMVar2->hw).aq_step_p[10] = 2;
              (pMVar2->hw).aq_step_p[0xb] = 3;
              (pMVar2->hw).aq_step_p[4] = -4;
              (pMVar2->hw).aq_step_p[5] = -3;
              (pMVar2->hw).aq_step_p[6] = -2;
              (pMVar2->hw).aq_step_p[7] = -1;
              (pMVar2->hw).aq_step_p[0] = -8;
              (pMVar2->hw).aq_step_p[1] = -7;
              (pMVar2->hw).aq_step_p[2] = -6;
              (pMVar2->hw).aq_step_p[3] = -5;
              lVar6 = 0;
              do {
                (pMVar2->hw).mode_bias[lVar6] = 8;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 8);
              (pMVar2->hw).skip_sad = 8;
              (pMVar2->hw).skip_bias = 8;
              mpp_dev_multi_offset_init((MppDevRegOffCfgs **)((long)hal + 0x38),0x18);
              *(undefined8 *)((long)hal + 0x148) = *(undefined8 *)((long)hal + 0x38);
              pHVar5 = vepu580_h264e_tune_init((HalH264eVepu580Ctx *)hal);
              *(HalH264eVepu580Tune **)((long)hal + 0x168) = pHVar5;
              *(MppCbCtx **)((long)hal + 0x1f8) = cfg->output_cb;
              cfg->cap_recn_out = 1;
              if (*(int *)((long)hal + 0x14) == 0) {
                MVar3 = MPP_OK;
              }
              else {
                MVar3 = MPP_OK;
                lVar6 = 0;
                uVar8 = 0;
                do {
                  h264e_vepu_stream_amend_init
                            ((HalH264eVepuStreamAmend *)(*(long *)((long)hal + 0x1a8) + lVar6));
                  uVar8 = uVar8 + 1;
                  lVar6 = lVar6 + 0x60;
                } while (uVar8 < *(uint *)((long)hal + 0x14));
              }
              goto LAB_0022181e;
            }
            pcVar7 = "init poll cfg buffer failed\n";
            goto LAB_00221b62;
          }
          pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                   (ulong)*(uint *)((long)hal + 0x14) * 0x28);
          *(void **)((long)hal + 0x1b0) = pvVar4;
          if (pvVar4 != (void *)0x0) {
            pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",
                                     (ulong)*(uint *)((long)hal + 0x14) * 0x90);
            *(void **)((long)hal + 0x1b8) = pvVar4;
            if (pvVar4 != (void *)0x0) {
              pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",0x10c);
              *(void **)((long)hal + 0x80) = pvVar4;
              if (pvVar4 != (void *)0x0) {
                pvVar4 = mpp_osal_malloc("hal_h264e_vepu580_init",0xbc);
                *(void **)((long)hal + 0x88) = pvVar4;
                if (pvVar4 != (void *)0x0) goto LAB_0022194e;
              }
            }
          }
        }
        pcVar7 = "init amend data failed\n";
      }
LAB_00221b62:
      _mpp_log_l(2,"hal_h264e_vepu580",pcVar7,"hal_h264e_vepu580_init");
      MVar3 = MPP_ERR_MALLOC;
      goto LAB_0022181e;
    }
    pcVar7 = "init vepu buffer failed ret: %d\n";
  }
  else {
    pcVar7 = "mpp_dev_init failed. ret: %d\n";
  }
  _mpp_log_l(2,"hal_h264e_vepu580",pcVar7,"hal_h264e_vepu580_init",(ulong)(uint)MVar3);
LAB_0022181e:
  if (MVar3 != MPP_OK) {
    hal_h264e_vepu580_deinit(hal);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_init",hal);
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_h264e_vepu580_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu580Ctx *p = (HalH264eVepu580Ctx *)hal;
    MPP_RET ret = MPP_OK;
    RK_U32 i;

    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    mpp_env_get_u32("disable_rcb_buf", &disable_rcb_buf, 0);

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;
    p->task_cnt = cfg->task_cnt;
    mpp_assert(p->task_cnt && p->task_cnt <= MAX_TASK_CNT);

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    p->regs_sets = mpp_malloc(HalVepu580RegSet, p->task_cnt);
    if (NULL == p->regs_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init register buffer failed\n");
        goto DONE;
    }
    p->amend_sets = mpp_malloc(HalH264eVepuStreamAmend, p->task_cnt);
    if (NULL == p->amend_sets) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init amend data failed\n");
        goto DONE;
    }

    if (p->task_cnt > 1) {
        p->prefix_sets = mpp_malloc(H264ePrefixNal, p->task_cnt);
        if (NULL == p->prefix_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->slice_sets = mpp_malloc(H264eSlice, p->task_cnt);
        if (NULL == p->slice_sets) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->reorder = mpp_malloc(H264eReorderInfo, 1);
        if (NULL == p->reorder) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }

        p->marking = mpp_malloc(H264eMarkingInfo, 1);
        if (NULL == p->marking) {
            ret = MPP_ERR_MALLOC;
            mpp_err_f("init amend data failed\n");
            goto DONE;
        }
    }

    p->poll_slice_max = 8;
    p->poll_cfg_size = (sizeof(p->poll_cfgs) + sizeof(RK_S32) * p->poll_slice_max);
    p->poll_cfgs = mpp_malloc_size(MppDevPollCfg, p->poll_cfg_size * p->task_cnt);
    if (NULL == p->poll_cfgs) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init poll cfg buffer failed\n");
        goto DONE;
    }

    p->osd_cfg.reg_base = &p->regs_sets->reg_osd;
    p->osd_cfg.dev = p->dev;
    p->osd_cfg.reg_cfg = NULL;
    p->osd_cfg.plt_cfg = &p->cfg->plt_cfg;
    p->osd_cfg.osd_data = NULL;
    p->osd_cfg.osd_data2 = NULL;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 2;
        hw->qp_delta_row    = 2;
        hw->extra_buf       = 1;
        hw->qbias_i         = 683;
        hw->qbias_p         = 341;
        hw->qbias_en        = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));

        for (i = 0; i < MPP_ARRAY_ELEMS(hw->mode_bias); i++)
            hw->mode_bias[i] = 8;

        hw->skip_sad  = 8;
        hw->skip_bias = 8;
    }
    mpp_dev_multi_offset_init(&p->offsets, 24);
    p->osd_cfg.reg_cfg = p->offsets;

    p->tune = vepu580_h264e_tune_init(p);
    p->output_cb = cfg->output_cb;

    cfg->cap_recn_out = 1;

    for (i = 0; i < p->task_cnt; i++)
        h264e_vepu_stream_amend_init(&p->amend_sets[i]);

DONE:
    if (ret)
        hal_h264e_vepu580_deinit(hal);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}